

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dm_tools.cxx
# Opt level: O0

void __thiscall dm_tools::process(dm_tools *this,cl_parser *cl)

{
  float fVar1;
  bool bVar2;
  target_format tVar3;
  size_t sVar4;
  char *path;
  xr_dm *this_00;
  undefined8 uVar5;
  float *pfVar6;
  uint32_t *puVar7;
  xr_dm *dm;
  char *source;
  size_t num_params;
  size_t i;
  target_format format;
  cl_parser *cl_local;
  dm_tools *this_local;
  
  tVar3 = object_tools::get_target_format(&this->super_object_tools,cl);
  if ((tVar3 < TARGET_SKL) || (tVar3 == TARGET_OBJECT)) {
    bVar2 = batch_helper::prepare_target_name(&(this->super_object_tools).super_batch_helper,cl);
    if (bVar2) {
      num_params = 0;
      sVar4 = cl_parser::num_params(cl);
      for (; num_params != sVar4; num_params = num_params + 1) {
        path = cl_parser::param(cl,num_params);
        this_00 = (xr_dm *)operator_new(0x250);
        xray_re::xr_dm::xr_dm(this_00);
        bVar2 = xray_re::xr_dm::load_dm(this_00,path);
        if (bVar2) {
          if (tVar3 == TARGET_DEFAULT) {
LAB_00126cd9:
            object_tools::save_object(&this->super_object_tools,(xr_object *)this_00,path,SOC);
          }
          else if (tVar3 == TARGET_INFO) {
            xray_re::xr_dm::shader_abi_cxx11_(this_00);
            uVar5 = std::__cxx11::string::c_str();
            xray_re::msg("shader: %s",uVar5);
            xray_re::xr_dm::texture_abi_cxx11_(this_00);
            uVar5 = std::__cxx11::string::c_str();
            xray_re::msg("texture: %s",uVar5);
            pfVar6 = xray_re::xr_dm::min_scale(this_00);
            fVar1 = *pfVar6;
            pfVar6 = xray_re::xr_dm::max_scale(this_00);
            xray_re::msg("scale (min/max): %f/%f",(double)fVar1,(double)*pfVar6);
            puVar7 = xray_re::xr_dm::flags(this_00);
            xray_re::msg("flags: %8.8x",(ulong)*puVar7);
          }
          else if (tVar3 == TARGET_OBJECT) goto LAB_00126cd9;
        }
        else {
          xray_re::msg("can\'t load %s",path);
        }
        if (this_00 != (xr_dm *)0x0) {
          (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
        }
      }
    }
  }
  else {
    xray_re::msg("unsupported options combination");
  }
  return;
}

Assistant:

void dm_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_DEFAULT:
	case TARGET_INFO:
	case TARGET_OBJECT:
		break;
	default:
		msg("unsupported options combination");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_dm* dm = new xr_dm;
		if (dm->load_dm(source)) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_OBJECT:
				save_object(*dm, source, xr_sg_type::SOC);
				break;
			case TARGET_INFO:
				msg("shader: %s", dm->shader().c_str());
				msg("texture: %s", dm->texture().c_str());
				msg("scale (min/max): %f/%f", dm->min_scale(), dm->max_scale());
				msg("flags: %8.8" PRIx32, dm->flags());
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete dm;
	}
}